

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathFrustum.h
# Opt level: O0

float __thiscall Imath_3_2::Frustum<float>::normalizedZToDepthExc(Frustum<float> *this,float zval)

{
  domain_error *this_00;
  long in_RDI;
  float in_XMM0_Da;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float farMinusNear;
  float farTimesNear;
  float Zp;
  float local_4;
  
  fVar1 = in_XMM0_Da + in_XMM0_Da + -1.0;
  if ((*(byte *)(in_RDI + 0x20) & 1) == 0) {
    local_4 = *(float *)(in_RDI + 0xc) * 2.0 * *(float *)(in_RDI + 8);
    fVar1 = (fVar1 * (*(float *)(in_RDI + 0xc) - *(float *)(in_RDI + 8)) + -*(float *)(in_RDI + 0xc)
            ) - *(float *)(in_RDI + 8);
    fVar2 = abs<float>(fVar1);
    if (fVar2 < 1.0) {
      fVar2 = abs<float>(local_4);
      fVar3 = std::numeric_limits<float>::max();
      fVar4 = abs<float>(fVar1);
      if (fVar3 * fVar4 < fVar2) {
        this_00 = (domain_error *)__cxa_allocate_exception(0x10);
        std::domain_error::domain_error
                  (this_00,
                   "Frustum::normalizedZToDepth cannot be computed: near and far clipping planes of the viewing frustum may be too close to each other"
                  );
        __cxa_throw(this_00,&std::domain_error::typeinfo,std::domain_error::~domain_error);
      }
    }
    local_4 = local_4 / fVar1;
  }
  else {
    local_4 = -(fVar1 * (*(float *)(in_RDI + 0xc) - *(float *)(in_RDI + 8)) +
               *(float *)(in_RDI + 0xc) + *(float *)(in_RDI + 8)) / 2.0;
  }
  return local_4;
}

Assistant:

IMATH_CONSTEXPR14 T
Frustum<T>::normalizedZToDepthExc (T zval) const
{
    T Zp = zval * T (2) - T (1);

    if (_orthographic)
    {
        return -(Zp * (_farPlane - _nearPlane) + (_farPlane + _nearPlane)) /
               T (2);
    }
    else
    {
        T farTimesNear = 2 * _farPlane * _nearPlane;
        T farMinusNear = Zp * (_farPlane - _nearPlane) - _farPlane - _nearPlane;

        if (abs (farMinusNear) < 1 &&
            abs (farTimesNear) >
                std::numeric_limits<T>::max () * abs (farMinusNear))
        {
            throw std::domain_error (
                "Frustum::normalizedZToDepth cannot be computed: "
                "near and far clipping planes of the viewing frustum "
                "may be too close to each other");
        }

        return farTimesNear / farMinusNear;
    }
}